

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint readChunk_mDCv(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  uint uVar1;
  
  uVar1 = 0x77;
  if (chunkLength == 0x18) {
    info->mdcv_defined = 1;
    info->mdcv_red_x = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    info->mdcv_red_y = (uint)(ushort)(*(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8);
    info->mdcv_green_x = (uint)(ushort)(*(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8);
    info->mdcv_green_y = (uint)(ushort)(*(ushort *)(data + 6) << 8 | *(ushort *)(data + 6) >> 8);
    info->mdcv_blue_x = (uint)(ushort)(*(ushort *)(data + 8) << 8 | *(ushort *)(data + 8) >> 8);
    info->mdcv_blue_y = (uint)(ushort)(*(ushort *)(data + 10) << 8 | *(ushort *)(data + 10) >> 8);
    info->mdcv_white_x = (uint)(ushort)(*(ushort *)(data + 0xc) << 8 | *(ushort *)(data + 0xc) >> 8)
    ;
    info->mdcv_white_y = (uint)(ushort)(*(ushort *)(data + 0xe) << 8 | *(ushort *)(data + 0xe) >> 8)
    ;
    uVar1 = *(uint *)(data + 0x10);
    info->mdcv_max_luminance =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(data + 0x14);
    info->mdcv_min_luminance =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_mDCv(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if(chunkLength != 24) return 119; /*invalid mDCv chunk size*/

  info->mdcv_defined = 1;
  info->mdcv_red_x = 256u * data[0] + data[1];
  info->mdcv_red_y = 256u * data[2] + data[3];
  info->mdcv_green_x = 256u * data[4] + data[5];
  info->mdcv_green_y = 256u * data[6] + data[7];
  info->mdcv_blue_x = 256u * data[8] + data[9];
  info->mdcv_blue_y = 256u * data[10] + data[11];
  info->mdcv_white_x = 256u * data[12] + data[13];
  info->mdcv_white_y = 256u * data[14] + data[15];
  info->mdcv_max_luminance = 16777216u * data[16] + 65536u * data[17] + 256u * data[18] + data[19];
  info->mdcv_min_luminance = 16777216u * data[20] + 65536u * data[21] + 256u * data[22] + data[23];

  return 0; /* OK */
}